

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3s.hpp
# Opt level: O3

void __thiscall trng::yarn3s::jump2(yarn3s *this,uint s)

{
  long lVar1;
  long lVar2;
  int32_t *piVar3;
  long lVar4;
  long lVar5;
  int k;
  long lVar6;
  uint uVar7;
  result_type d [3];
  result_type c [9];
  undefined8 local_a8;
  int local_a0;
  undefined8 local_98;
  int local_90;
  int32_t local_88 [2];
  int local_80;
  int32_t local_7c [9];
  int32_t local_58 [12];
  
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[8] = 0;
  local_88 = (int32_t  [2])*(undefined8 *)(this->P).a;
  local_80 = (this->P).a[2];
  local_7c[0] = 1;
  local_7c[1] = 0;
  local_7c[2] = 0;
  local_7c[3] = 0;
  local_7c[4] = 1;
  local_7c[5] = 0;
  if (s != 0) {
    uVar7 = 0;
    do {
      int_math::matrix_mult<3>
                ((int32_t (*) [9])local_88,(int32_t (*) [9])local_88,(int32_t (*) [9])local_58,
                 0x7fffadb3);
      if (s <= uVar7 + 1) break;
      int_math::matrix_mult<3>
                ((int32_t (*) [9])local_58,(int32_t (*) [9])local_58,(int32_t (*) [9])local_88,
                 0x7fffadb3);
      uVar7 = uVar7 + 2;
    } while (uVar7 < s);
  }
  local_98 = *(undefined8 *)(this->S).r;
  local_90 = (this->S).r[2];
  if ((s & 1) == 0) {
    piVar3 = local_88;
    lVar4 = 0;
    do {
      lVar6 = 0;
      lVar5 = 0;
      do {
        lVar2 = ((long)*(int *)((long)&local_98 + lVar6 * 4) * (long)piVar3[lVar6]) % 0x7fffadb3;
        lVar1 = lVar2 + lVar5;
        lVar5 = lVar5 + -0x7fffadb3 + lVar2;
        if (lVar1 < 0x7fffadb3) {
          lVar5 = lVar1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      *(int *)((long)&local_a8 + lVar4 * 4) = (int)lVar5;
      lVar4 = lVar4 + 1;
      piVar3 = piVar3 + 3;
    } while (lVar4 != 3);
  }
  else {
    piVar3 = local_58;
    lVar4 = 0;
    do {
      lVar6 = 0;
      lVar5 = 0;
      do {
        lVar2 = ((long)*(int *)((long)&local_98 + lVar6 * 4) * (long)piVar3[lVar6]) % 0x7fffadb3;
        lVar1 = lVar2 + lVar5;
        lVar5 = lVar5 + -0x7fffadb3 + lVar2;
        if (lVar1 < 0x7fffadb3) {
          lVar5 = lVar1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      *(int *)((long)&local_a8 + lVar4 * 4) = (int)lVar5;
      lVar4 = lVar4 + 1;
      piVar3 = piVar3 + 3;
    } while (lVar4 != 3);
  }
  *(undefined8 *)(this->S).r = local_a8;
  (this->S).r[2] = local_a0;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn3s::jump2(unsigned int s) {
    result_type b[9], c[9]{};
    b[0] = P.a[0];
    b[1] = P.a[1];
    b[2] = P.a[2];
    b[3] = 1;
    b[4] = 0;
    b[5] = 0;
    b[6] = 0;
    b[7] = 1;
    b[8] = 0;
    for (unsigned int i{0}; i < s; ++i) {
      int_math::matrix_mult<3>(b, b, c, modulus);
      ++i;
      if (not(i < s))
        break;
      int_math::matrix_mult<3>(c, c, b, modulus);
    }
    const result_type r[3]{S.r[0], S.r[1], S.r[2]};
    result_type d[3];
    if ((s & 1u) == 0)
      int_math::matrix_vec_mult<3>(b, r, d, modulus);
    else
      int_math::matrix_vec_mult<3>(c, r, d, modulus);
    S.r[0] = d[0];
    S.r[1] = d[1];
    S.r[2] = d[2];
  }